

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int binCollFunc(void *padFlag,int nKey1,void *pKey1,int nKey2,void *pKey2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t __n;
  int iVar5;
  
  iVar3 = nKey1 - nKey2;
  iVar5 = nKey2;
  if (nKey1 < nKey2) {
    iVar5 = nKey1;
  }
  __n = (size_t)iVar5;
  iVar2 = memcmp(pKey1,pKey2,__n);
  if ((iVar2 == 0) && (iVar2 = iVar3, padFlag != (void *)0x0)) {
    uVar4 = nKey1 - iVar5;
    if (uVar4 != 0 && iVar5 <= nKey1) {
      do {
        if (*(char *)((long)pKey1 + (ulong)uVar4 + (__n - 1)) != ' ') goto LAB_001a58cc;
        bVar1 = 1 < (int)uVar4;
        uVar4 = uVar4 - 1;
      } while (bVar1);
      uVar4 = 0;
    }
LAB_001a58cc:
    if (uVar4 == 0) {
      uVar4 = nKey2 - iVar5;
      if (uVar4 != 0 && iVar5 <= nKey2) {
        do {
          if (*(char *)((long)pKey2 + (ulong)uVar4 + (__n - 1)) != ' ') goto LAB_001a58f1;
          bVar1 = 1 < (int)uVar4;
          uVar4 = uVar4 - 1;
        } while (bVar1);
        uVar4 = 0;
      }
LAB_001a58f1:
      if (uVar4 == 0) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int binCollFunc(
  void *padFlag,
  int nKey1, const void *pKey1,
  int nKey2, const void *pKey2
){
  int rc, n;
  n = nKey1<nKey2 ? nKey1 : nKey2;
  rc = memcmp(pKey1, pKey2, n);
  if( rc==0 ){
    if( padFlag
     && allSpaces(((char*)pKey1)+n, nKey1-n)
     && allSpaces(((char*)pKey2)+n, nKey2-n)
    ){
      /* Leave rc unchanged at 0 */
    }else{
      rc = nKey1 - nKey2;
    }
  }
  return rc;
}